

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlCtxtReadFile(xmlParserCtxtPtr ctxt,char *filename,char *encoding,int options)

{
  xmlParserInputPtr value;
  xmlDocPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0 && filename != (char *)0x0) {
    xmlInitParser();
    xmlCtxtReset(ctxt);
    value = xmlLoadExternalEntity(filename,(char *)0x0,ctxt);
    if (value != (xmlParserInputPtr)0x0) {
      inputPush(ctxt,value);
      pxVar1 = xmlDoRead(ctxt,(char *)0x0,encoding,options,1);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadFile(xmlParserCtxtPtr ctxt, const char *filename,
                const char *encoding, int options)
{
    xmlParserInputPtr stream;

    if (filename == NULL)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    xmlCtxtReset(ctxt);

    stream = xmlLoadExternalEntity(filename, NULL, ctxt);
    if (stream == NULL) {
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, NULL, encoding, options, 1));
}